

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::addItem(QGraphicsScene *this,QGraphicsItem *item)

{
  undefined1 *puVar1;
  int *piVar2;
  QGraphicsScenePrivate *this_00;
  Data *pDVar3;
  QGraphicsWidgetPrivate *this_01;
  qreal qVar4;
  QGraphicsItemPrivate *pQVar5;
  qreal qVar6;
  QGraphicsItem **ppQVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  WindowType WVar12;
  PanelModality PVar13;
  QGraphicsScene *pQVar14;
  QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
  *pQVar15;
  _Rb_tree_node_base *p_Var16;
  QGraphicsWidget *pQVar17;
  size_t sVar18;
  QGraphicsItemPrivate *pQVar19;
  QGraphicsItem *pQVar20;
  uint uVar21;
  _Rb_tree_node_base *p_Var22;
  QGraphicsWidget *pQVar23;
  char *pcVar24;
  long lVar25;
  size_t sVar26;
  long in_FS_OFFSET;
  QGraphicsScene *local_a8;
  QGraphicsItem *item_local;
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item_local = item;
  if (item == (QGraphicsItem *)0x0) {
    pcVar24 = "QGraphicsScene::addItem: cannot add null item";
  }
  else {
    pQVar14 = (QGraphicsScene *)((item->d_ptr).d)->scene;
    if (pQVar14 != this) {
      this_00 = *(QGraphicsScenePrivate **)(this + 8);
      if (pQVar14 != (QGraphicsScene *)0x0) {
        removeItem(pQVar14,item);
      }
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      pcStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      local_a8 = this;
      ::QVariant::fromValue<QGraphicsScene_*,_true>
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<QGraphicsScene_*>,_std::is_destructible<QGraphicsScene_*>_>,_QVariant>
                  *)&local_78,(QGraphicsScene **)&local_a8);
      (*item->_vptr_QGraphicsItem[0x21])(&local_58,item,0xb,&local_78);
      ::QVariant::~QVariant((QVariant *)&local_78);
      pQVar14 = (QGraphicsScene *)qvariant_cast<QGraphicsScene*>((QVariant *)&local_58);
      if (pQVar14 == this) {
        if ((this_00->unpolishedItems).d.size == 0) {
          local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          iVar10 = (*(code *)**(undefined8 **)this)(this);
          local_78._0_16_ = QMetaObject::method(iVar10);
          QMetaMethod::invoke<>((QMetaMethod *)&local_78,(QObject *)this,QueuedConnection);
        }
        QList<QGraphicsItem_*>::append(&this_00->unpolishedItems,item_local);
        puVar1 = &((item_local->d_ptr).d)->field_0x168;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
        pQVar19 = (item_local->d_ptr).d;
        if ((pQVar19->parent != (QGraphicsItem *)0x0) &&
           ((QGraphicsScene *)((pQVar19->parent->d_ptr).d)->scene != this)) {
          QGraphicsItem::setParentItem(item_local,(QGraphicsItem *)0x0);
          pQVar19 = (item_local->d_ptr).d;
        }
        pQVar19->scene = (QGraphicsScene *)pQVar14;
        (**(code **)(*(long *)this_00->index + 0xb0))();
        if (((item_local->d_ptr).d)->parent == (QGraphicsItem *)0x0) {
          QGraphicsScenePrivate::registerTopLevelItem(this_00,item_local);
        }
        local_78._16_8_ = 0;
        uStack_60 = 0;
        local_78.shared = (PrivateShared *)0x0;
        local_78._8_8_ = 0;
        sVar26 = 0;
        pQVar20 = item_local;
        QGraphicsScenePrivate::markDirty
                  (this_00,item_local,(QRectF *)&local_78,false,false,false,false,false);
        uVar11 = *(uint *)&this_00->field_0xb8;
        uVar21 = uVar11 | 2;
        *(uint *)&this_00->field_0xb8 = uVar21;
        this_00->selectionChanging = this_00->selectionChanging + 1;
        pDVar3 = (this_00->selectedItems).q_hash.d;
        if (pDVar3 != (Data *)0x0) {
          sVar26 = (size_t)(int)pDVar3->size;
        }
        if ((uVar11 >> 0xc & 1) != 0) {
          this_01 = (QGraphicsWidgetPrivate *)(item_local->d_ptr).d;
          uVar11 = (uint)*(undefined8 *)&(this_01->super_QGraphicsItemPrivate).field_0x160;
          if ((uVar11 >> 10 & 1) == 0) {
            if ((uVar11 >> 0x18 & 1) != 0) {
              bVar9 = QGraphicsWidgetPrivate::hasDecoration(this_01);
              uVar21 = *(uint *)&this_00->field_0xb8;
              if (bVar9) goto LAB_00597a40;
            }
          }
          else {
LAB_00597a40:
            *(uint *)&this_00->field_0xb8 = uVar21 & 0xffffefff;
            QGraphicsScenePrivate::enableMouseTrackingOnViews(this_00);
            uVar21 = *(uint *)&this_00->field_0xb8;
          }
        }
        uVar11 = uVar21;
        if (((uVar21 >> 0xd & 1) != 0) && ((((item_local->d_ptr).d)->field_0x161 & 0x80) != 0)) {
          uVar11 = uVar21 & 0xffffdfff;
          *(uint *)&this_00->field_0xb8 = uVar11;
          if ((uVar21 >> 0xc & 1) != 0) {
            QGraphicsScenePrivate::enableMouseTrackingOnViews(this_00);
            uVar11 = *(uint *)&this_00->field_0xb8;
          }
        }
        if (((uVar11 >> 0x10 & 1) != 0) && ((((item_local->d_ptr).d)->field_0x167 & 8) != 0)) {
          *(uint *)&this_00->field_0xb8 = uVar11 & 0xfffeffff;
          QGraphicsScenePrivate::enableTouchEventsOnViews(this_00);
        }
        pQVar15 = (((item_local->d_ptr).d)->gestureContext).d.d.ptr;
        if (pQVar15 ==
            (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
             *)0x0) {
          p_Var16 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var16 = (pQVar15->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        while( true ) {
          p_Var22 = &(pQVar15->m)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (pQVar15 ==
              (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
               *)0x0) {
            p_Var22 = (_Rb_tree_node_base *)0x0;
          }
          if (p_Var16 == p_Var22) break;
          QGraphicsScenePrivate::grabGesture(this_00,pQVar20,p_Var16[1]._M_color);
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
          pQVar15 = (((item_local->d_ptr).d)->gestureContext).d.d.ptr;
        }
        bVar9 = QGraphicsItem::isSelected(item_local);
        if (bVar9) {
          QSet<QGraphicsItem_*>::operator<<(&this_00->selectedItems,&item_local);
        }
        bVar9 = QGraphicsItem::isWidget(item_local);
        if (bVar9) {
          bVar9 = QGraphicsItem::isVisible(item_local);
          if (bVar9) {
            WVar12 = QGraphicsWidget::windowType((QGraphicsWidget *)(item_local + -1));
            if (WVar12 == Popup) {
              pQVar23 = (QGraphicsWidget *)(item_local + -1);
              if (item_local == (QGraphicsItem *)0x0) {
                pQVar23 = (QGraphicsWidget *)0x0;
              }
              QGraphicsScenePrivate::addPopup(this_00,pQVar23);
            }
          }
        }
        bVar9 = QGraphicsItem::isPanel(item_local);
        if (bVar9) {
          bVar9 = QGraphicsItem::isVisible(item_local);
          if (bVar9) {
            PVar13 = QGraphicsItem::panelModality(item_local);
            if (PVar13 != NonModal) {
              QGraphicsScenePrivate::enterModal(this_00,item_local,NonModal);
            }
          }
        }
        bVar9 = QGraphicsItem::isWidget(item_local);
        if (bVar9) {
          pQVar23 = (QGraphicsWidget *)(item_local + -1);
          if (item_local == (QGraphicsItem *)0x0) {
            pQVar23 = (QGraphicsWidget *)0x0;
          }
          if (this_00->tabFocusFirst == (QGraphicsWidget *)0x0) {
            this_00->tabFocusFirst = pQVar23;
          }
          else {
            pQVar20 = &(pQVar23->super_QGraphicsObject).super_QGraphicsItem;
            pQVar17 = QGraphicsItem::parentWidget(pQVar20);
            if (pQVar17 == (QGraphicsWidget *)0x0) {
              bVar9 = QGraphicsItem::isPanel(pQVar20);
              if (!bVar9) {
                pQVar17 = this_00->tabFocusFirst;
                pQVar19 = (pQVar17->super_QGraphicsObject).super_QGraphicsItem.d_ptr.d;
                qVar4 = pQVar19[1].needsRepaint.w;
                *(QGraphicsWidget **)(*(long *)((long)qVar4 + 0x18) + 0x1c0) = pQVar23;
                pQVar5 = (pQVar23->super_QGraphicsObject).super_QGraphicsItem.d_ptr.d;
                qVar6 = pQVar5[1].needsRepaint.w;
                *(QGraphicsWidget **)(*(long *)((long)qVar6 + 0x18) + 0x1c0) = pQVar17;
                pQVar19[1].needsRepaint.w = qVar6;
                pQVar5[1].needsRepaint.w = qVar4;
              }
            }
          }
        }
        QGraphicsItemPrivate::ensureSortedChildren((item_local->d_ptr).d);
        pQVar19 = (item_local->d_ptr).d;
        ppQVar7 = (pQVar19->children).d.ptr;
        lVar8 = (pQVar19->children).d.size;
        for (lVar25 = 0; lVar8 << 3 != lVar25; lVar25 = lVar25 + 8) {
          addItem(this,*(QGraphicsItem **)((long)ppQVar7 + lVar25));
        }
        pQVar19 = (item_local->d_ptr).d;
        (*pQVar19->_vptr_QGraphicsItemPrivate[5])(pQVar19,(ulong)*(uint *)&this_00->field_0x2b0);
        pQVar19 = (item_local->d_ptr).d;
        uVar11 = QPalette::resolveMask();
        (*pQVar19->_vptr_QGraphicsItemPrivate[6])(pQVar19,(ulong)uVar11);
        piVar2 = &this_00->selectionChanging;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          pDVar3 = (this_00->selectedItems).q_hash.d;
          if (pDVar3 == (Data *)0x0) {
            sVar18 = 0;
          }
          else {
            sVar18 = pDVar3->size;
          }
          if (sVar18 != sVar26) {
            selectionChanged(this);
          }
        }
        (*item_local->_vptr_QGraphicsItem[0x21])(&local_98,item_local,0x10,&local_58);
        ::QVariant::~QVariant(&local_98);
        if (this_00->childExplicitActivation == 0) {
          pQVar19 = (item_local->d_ptr).d;
          if ((*(uint *)&pQVar19->field_0x168 & 4) != 0) {
            this_00->childExplicitActivation = ((*(uint *)&pQVar19->field_0x168 & 8) == 0) + 1;
            goto LAB_00597da7;
          }
LAB_00597dd1:
          if (pQVar19->parent == (QGraphicsItem *)0x0) {
LAB_00597ddb:
            this_00->childExplicitActivation = 0;
          }
          if ((this_00->lastActivePanel == (QGraphicsItem *)0x0) &&
             (this_00->activePanel == (QGraphicsItem *)0x0)) {
            bVar9 = QGraphicsItem::isPanel(item_local);
            if (bVar9) {
              if (*(int *)(*(long *)(this + 8) + 0x1b8) < 1) {
                this_00->lastActivePanel = item_local;
              }
              else {
                setActivePanel(this,item_local);
              }
            }
          }
        }
        else {
LAB_00597da7:
          bVar9 = QGraphicsItem::isPanel(item_local);
          if (!bVar9) {
            pQVar19 = (item_local->d_ptr).d;
            goto LAB_00597dd1;
          }
          if (this_00->childExplicitActivation == 1) {
            setActivePanel(this,item_local);
            goto LAB_00597ddb;
          }
          this_00->childExplicitActivation = 0;
        }
        if ((((item_local->d_ptr).d)->field_0x166 & 1) != 0) {
          QGraphicsScenePrivate::registerScenePosItem(this_00,item_local);
        }
        if ((this_00->focusItem == (QGraphicsItem *)0x0) && (item_local != this_00->lastFocusItem))
        {
          pQVar20 = QGraphicsItem::focusItem(item_local);
          if (pQVar20 == item_local) {
            pQVar20 = QGraphicsItem::focusItem(item_local);
            QGraphicsItem::setFocus(pQVar20,OtherFocusReason);
          }
        }
        QGraphicsScenePrivate::updateInputMethodSensitivityInViews(this_00);
      }
      else if ((pQVar14 != (QGraphicsScene *)0x0) &&
              ((QGraphicsScene *)((item_local->d_ptr).d)->scene != pQVar14)) {
        addItem(pQVar14,item_local);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_00597e61;
    }
    pcVar24 = "QGraphicsScene::addItem: item has already been added to this scene";
  }
  pcStack_40 = "default";
  local_58._20_4_ = 0;
  local_58._16_4_ = 0;
  local_58._12_4_ = 0;
  local_58._8_4_ = 0;
  local_58._4_4_ = 0;
  local_58._0_4_ = 2;
  QMessageLogger::warning((char *)local_58.data,pcVar24);
LAB_00597e61:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::addItem(QGraphicsItem *item)
{
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::addItem: cannot add null item");
        return;
    }
    if (item->d_ptr->scene == this) {
        qWarning("QGraphicsScene::addItem: item has already been added to this scene");
        return;
    }
    // Remove this item from its existing scene
    if (QGraphicsScene *oldScene = item->d_ptr->scene)
        oldScene->removeItem(item);

    // Notify the item that its scene is changing, and allow the item to
    // react.
    const QVariant newSceneVariant(item->itemChange(QGraphicsItem::ItemSceneChange,
                                                    QVariant::fromValue<QGraphicsScene *>(this)));
    QGraphicsScene *targetScene = qvariant_cast<QGraphicsScene *>(newSceneVariant);
    if (targetScene != this) {
        if (targetScene && item->d_ptr->scene != targetScene)
            targetScene->addItem(item);
        return;
    }

    if (d->unpolishedItems.isEmpty()) {
        QMetaMethod method = metaObject()->method(d->polishItemsIndex);
        method.invoke(this, Qt::QueuedConnection);
    }
    d->unpolishedItems.append(item);
    item->d_ptr->pendingPolish = true;

    // Detach this item from its parent if the parent's scene is different
    // from this scene.
    if (QGraphicsItem *itemParent = item->d_ptr->parent) {
        if (itemParent->d_ptr->scene != this)
            item->setParentItem(nullptr);
    }

    // Add the item to this scene
    item->d_func()->scene = targetScene;

    // Add the item in the index
    d->index->addItem(item);

    // Add to list of toplevels if this item is a toplevel.
    if (!item->d_ptr->parent)
        d->registerTopLevelItem(item);

    // Add to list of items that require an update. We cannot assume that the
    // item is fully constructed, so calling item->update() can lead to a pure
    // virtual function call to boundingRect().
    d->markDirty(item);
    d->dirtyGrowingItemsBoundingRect = true;

    // Disable selectionChanged() for individual items
    ++d->selectionChanging;
    int oldSelectedItemSize = d->selectedItems.size();

    // Enable mouse tracking if we haven't already done so, and the item needs it.
    // We cannot use itemAcceptsHoverEvents_helper() here, since we need to enable
    // mouse tracking also if this item is temporarily blocked by a modal panel.

    auto needsMouseTracking = [](const QGraphicsItemPrivate *item) {
        return item->acceptsHover
                || (item->isWidget && static_cast<const QGraphicsWidgetPrivate *>(item)->hasDecoration());
    };

    if (d->allItemsIgnoreHoverEvents && needsMouseTracking(item->d_ptr.data())) {
        d->allItemsIgnoreHoverEvents = false;
        d->enableMouseTrackingOnViews();
    }
#ifndef QT_NO_CURSOR
    if (d->allItemsUseDefaultCursor && item->d_ptr->hasCursor) {
        d->allItemsUseDefaultCursor = false;
        if (d->allItemsIgnoreHoverEvents) // already enabled otherwise
            d->enableMouseTrackingOnViews();
    }
#endif //QT_NO_CURSOR

    // Enable touch events if the item accepts touch events.
    if (d->allItemsIgnoreTouchEvents && item->d_ptr->acceptTouchEvents) {
        d->allItemsIgnoreTouchEvents = false;
        d->enableTouchEventsOnViews();
    }

#ifndef QT_NO_GESTURES
    for (auto it = item->d_ptr->gestureContext.constBegin();
              it != item->d_ptr->gestureContext.constEnd(); ++it)
        d->grabGesture(item, it.key());
#endif

    // Update selection lists
    if (item->isSelected())
        d->selectedItems << item;
    if (item->isWidget() && item->isVisible() && static_cast<QGraphicsWidget *>(item)->windowType() == Qt::Popup)
        d->addPopup(static_cast<QGraphicsWidget *>(item));
    if (item->isPanel() && item->isVisible() && item->panelModality() != QGraphicsItem::NonModal)
        d->enterModal(item);

    // Update creation order focus chain. Make sure to leave the widget's
    // internal tab order intact.
    if (item->isWidget()) {
        QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(item);
        if (!d->tabFocusFirst) {
            // No first tab focus widget - make this the first tab focus
            // widget.
            d->tabFocusFirst = widget;
        } else if (!widget->parentWidget() && !widget->isPanel()) {
            // Adding a widget that is not part of a tab focus chain.
            QGraphicsWidget *myNewPrev = d->tabFocusFirst->d_func()->focusPrev;
            myNewPrev->d_func()->focusNext = widget;
            widget->d_func()->focusPrev->d_func()->focusNext = d->tabFocusFirst;
            d->tabFocusFirst->d_func()->focusPrev = widget->d_func()->focusPrev;
            widget->d_func()->focusPrev = myNewPrev;
        }
    }

    // Add all children recursively
    item->d_ptr->ensureSortedChildren();
    for (auto child : std::as_const(item->d_ptr->children))
        addItem(child);

    // Resolve font and palette.
    item->d_ptr->resolveFont(d->font.resolveMask());
    item->d_ptr->resolvePalette(d->palette.resolveMask());


    // Re-enable selectionChanged() for individual items
    --d->selectionChanging;
    if (!d->selectionChanging && d->selectedItems.size() != oldSelectedItemSize)
        emit selectionChanged();

    // Deliver post-change notification
    item->itemChange(QGraphicsItem::ItemSceneHasChanged, newSceneVariant);

    // Update explicit activation
    bool autoActivate = true;
    if (!d->childExplicitActivation && item->d_ptr->explicitActivate)
        d->childExplicitActivation = item->d_ptr->wantsActive ? 1 : 2;
    if (d->childExplicitActivation && item->isPanel()) {
        if (d->childExplicitActivation == 1)
            setActivePanel(item);
        else
            autoActivate = false;
        d->childExplicitActivation = 0;
    } else if (!item->d_ptr->parent) {
        d->childExplicitActivation = 0;
    }

    // Auto-activate this item's panel if nothing else has been activated
    if (autoActivate) {
        if (!d->lastActivePanel && !d->activePanel && item->isPanel()) {
            if (isActive())
                setActivePanel(item);
            else
                d->lastActivePanel = item;
        }
    }

    if (item->d_ptr->flags & QGraphicsItem::ItemSendsScenePositionChanges)
        d->registerScenePosItem(item);

    // Ensure that newly added items that have subfocus set, gain
    // focus automatically if there isn't a focus item already.
    if (!d->focusItem && item != d->lastFocusItem && item->focusItem() == item)
        item->focusItem()->setFocus();

    d->updateInputMethodSensitivityInViews();
}